

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O3

void gmath::refineOptimal(Matrix34d *RT1,Vector3d *p0,Vector3d *p1)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  pointer pdVar6;
  int k;
  long lVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  double *pdVar9;
  int k_2;
  double (*padVar10) [4];
  double *pdVar11;
  double *pdVar12;
  pointer *ppdVar13;
  int i;
  long lVar14;
  int i_15;
  pointer *ppdVar15;
  int j;
  long lVar16;
  int j_5;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar25;
  undefined1 auVar24 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  Vector3d e0;
  SVector<double,_3> ret_13;
  Vector3d e1;
  SMatrix<double,_3,_3> ret_2;
  Vector3d T;
  SMatrix<double,_3,_3> ret_4;
  Matrix33d F;
  SMatrix<double,_3,_3> ret_3;
  SMatrix<double,_3,_3> ret_8;
  Matrix33d invT0;
  Matrix33d R;
  vector<double,_std::allocator<double>_> r;
  Matrix33d invT1;
  Polynomial<double> local_448;
  double local_438;
  ulong uStack_430;
  double local_428 [4];
  double local_408;
  ulong uStack_400;
  double local_3f8 [4];
  undefined1 local_3d8 [16];
  double local_3c8;
  undefined1 local_3b8 [16];
  double local_3a8;
  ulong uStack_3a0;
  double local_398;
  undefined8 uStack_390;
  double local_380 [10];
  undefined8 uStack_330;
  double local_328 [4];
  double local_308;
  undefined8 uStack_300;
  double local_2f8 [10];
  double local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_298 [16];
  double local_280;
  double local_278;
  double local_270 [10];
  ulong uStack_220;
  undefined8 uStack_218;
  ulong uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  double local_1e0 [12];
  double local_180;
  undefined8 uStack_178;
  double local_170;
  double dStack_168;
  double local_160;
  undefined8 local_158;
  double local_150 [10];
  undefined8 uStack_100;
  double local_f8;
  ulong uStack_f0;
  double local_e8;
  ulong uStack_e0;
  double local_d8;
  ulong uStack_d0;
  double local_c8;
  ulong uStack_c0;
  vector<double,_std::allocator<double>_> local_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  double local_68 [3];
  undefined8 local_50;
  undefined8 uStack_48;
  double local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_150[3] = 0.0;
  local_150[5] = 0.0;
  local_150[6] = 0.0;
  local_150[1] = 0.0;
  local_150[2] = 0.0;
  local_150[7] = 0.0;
  local_150[0] = 1.0;
  local_150[4] = 1.0;
  local_150[8] = 1.0;
  lVar7 = 0;
  padVar10 = (double (*) [4])RT1;
  do {
    *(double *)((long)local_150 + lVar7 + 0x10) = (*(double (*) [4])*padVar10)[2];
    dVar19 = (*(double (*) [4])*padVar10)[1];
    *(double *)((long)local_150 + lVar7) = (*(double (*) [4])*padVar10)[0];
    *(double *)((long)local_150 + lVar7 + 8) = dVar19;
    lVar7 = lVar7 + 0x18;
    padVar10 = padVar10 + 1;
  } while (lVar7 != 0x48);
  local_328[0] = 0.0;
  local_328[1] = 0.0;
  local_328[2] = 0.0;
  lVar7 = 0;
  do {
    *(undefined8 *)((long)local_328 + lVar7) = *(undefined8 *)((long)RT1->v[0] + lVar7 * 4 + 0x18);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar7 = 0;
  pdVar9 = local_1e0 + 9;
  local_1e0[9] = 0.0;
  local_1e0[10] = -local_328[2];
  local_1e0[0xb] = local_328[1];
  local_180 = local_328[2];
  uStack_178 = 0;
  local_170 = -local_328[0];
  dStack_168 = -local_328[1];
  local_160 = local_328[0];
  local_158 = 0;
  local_270[3] = 0.0;
  local_270[1] = 0.0;
  local_270[2] = 0.0;
  local_270[5] = 0.0;
  local_270[6] = 0.0;
  local_270[7] = 0.0;
  local_270[0] = 1.0;
  local_270[4] = 1.0;
  local_270[8] = 1.0;
  do {
    lVar14 = 0;
    pdVar11 = local_150;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      pdVar12 = pdVar11;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar16 != 3);
      local_270[lVar7 * 3 + lVar14] = dVar19;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  local_180 = 0.0;
  lVar7 = 0;
  local_160 = 0.0;
  dStack_168 = 0.0;
  local_1e0[10] = 0.0;
  local_1e0[9] = 1.0;
  uStack_178 = 0x3ff0000000000000;
  local_158 = 0x3ff0000000000000;
  pdVar9 = local_68;
  local_50 = 0;
  local_30 = 0;
  uStack_38 = 0;
  local_68[1] = 0.0;
  local_68[0] = 1.0;
  uStack_48 = 0x3ff0000000000000;
  local_28 = 0x3ff0000000000000;
  auVar20._8_8_ = p0->v[2];
  auVar20._0_8_ = p0->v[2];
  auVar20 = divpd(*(undefined1 (*) [16])p0->v,auVar20);
  local_1e0[0xb] = auVar20._0_8_;
  local_170 = auVar20._8_8_;
  auVar22._8_8_ = p1->v[2];
  auVar22._0_8_ = p1->v[2];
  auVar22 = divpd(*(undefined1 (*) [16])p1->v,auVar22);
  local_68[2] = auVar22._0_8_;
  local_40 = auVar22._8_8_;
  pdVar11 = local_380;
  local_380[3] = 0.0;
  local_380[7] = 0.0;
  local_380[5] = 0.0;
  local_380[6] = 0.0;
  local_380[1] = 0.0;
  local_380[2] = 0.0;
  local_380[0] = 1.0;
  local_380[4] = 1.0;
  local_380[8] = 1.0;
  do {
    lVar14 = 0;
    pdVar12 = pdVar9;
    do {
      pdVar11[lVar14] = *pdVar12;
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar11 = pdVar11 + 3;
    pdVar9 = pdVar9 + 1;
  } while (lVar7 != 3);
  uStack_210 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  local_1f0 = 0;
  local_270[9] = 1.0;
  uStack_208 = 0x3ff0000000000000;
  local_1e8 = 0x3ff0000000000000;
  pdVar9 = local_380;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar11 = local_270;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      pdVar12 = pdVar11;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar16 != 3);
      local_270[lVar7 * 3 + lVar14 + 9] = dVar19;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  local_2f8[3] = 0.0;
  local_2f8[5] = 0.0;
  local_2f8[6] = 0.0;
  local_2f8[1] = 0.0;
  local_2f8[2] = 0.0;
  local_2f8[7] = 0.0;
  local_2f8[0] = 1.0;
  local_2f8[4] = 1.0;
  local_2f8[8] = 1.0;
  pdVar9 = local_270 + 9;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar11 = local_1e0 + 9;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      pdVar12 = pdVar11;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar16 != 3);
      local_2f8[lVar7 * 3 + lVar14] = dVar19;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)local_270 + lVar7 + 0x10) =
         *(undefined8 *)((long)local_2f8 + lVar7 + 0x10);
    uVar5 = *(undefined8 *)((long)local_2f8 + lVar7 + 8);
    *(undefined8 *)((long)local_270 + lVar7) = *(undefined8 *)((long)local_2f8 + lVar7);
    *(undefined8 *)((long)local_270 + lVar7 + 8) = uVar5;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  local_3c8 = local_328[2];
  local_3d8._0_8_ = local_328[0];
  local_3d8._8_8_ = local_328[1];
  pdVar9 = local_2f8;
  local_2f8[3] = 0.0;
  local_2f8[5] = 0.0;
  local_2f8[6] = 0.0;
  local_2f8[1] = 0.0;
  local_2f8[2] = 0.0;
  local_2f8[7] = 0.0;
  local_2f8[0] = 1.0;
  local_2f8[4] = 1.0;
  local_2f8[8] = 1.0;
  pdVar11 = local_150;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar12 = pdVar11;
    do {
      pdVar9[lVar14] = *pdVar12;
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
    pdVar11 = pdVar11 + 1;
  } while (lVar7 != 3);
  local_270[9] = 0.0;
  uStack_220 = 0;
  uStack_218 = 0;
  lVar7 = 0;
  do {
    local_270[lVar7 + 9] = -local_328[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_428[0] = 0.0;
  local_428[1] = 0.0;
  local_428[2] = 0.0;
  pdVar9 = local_2f8;
  lVar7 = 0;
  do {
    dVar19 = local_428[lVar7];
    lVar14 = 0;
    do {
      dVar19 = dVar19 + pdVar9[lVar14] * local_270[lVar14 + 9];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_428[lVar7] = dVar19;
    dVar19 = local_428[2];
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    local_428[lVar7] = local_428[lVar7] / dVar19;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(double *)(local_3d8 + lVar7 * 8) = *(double *)(local_3d8 + lVar7 * 8) / local_328[2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar23 = local_428[0] - auVar20._0_8_;
  dVar25 = local_428[1] - auVar20._8_8_;
  local_428[0] = dVar23;
  local_428[1] = dVar25;
  dVar19 = (double)local_3d8._0_8_ - auVar22._0_8_;
  dVar2 = (double)local_3d8._8_8_ - auVar22._8_8_;
  local_3d8._8_4_ = SUB84(dVar2,0);
  local_3d8._0_8_ = dVar19;
  local_3d8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  lVar7 = 0;
  do {
    local_428[lVar7] = local_428[lVar7] / SQRT(dVar23 * dVar23 + dVar25 * dVar25);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(double *)(local_3d8 + lVar7 * 8) =
         *(double *)(local_3d8 + lVar7 * 8) / SQRT(dVar19 * dVar19 + dVar2 * dVar2);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_2f8[2] = 0.0;
  local_2f8[5] = 0.0;
  local_2f8[6] = 0.0;
  local_2f8[7] = 0.0;
  local_2f8[0] = local_428[0];
  local_2f8[1] = local_428[1];
  local_2f8[3] = -local_428[1];
  local_2f8[4] = local_428[0];
  local_2f8[8] = 1.0;
  pdVar9 = local_270 + 9;
  uStack_218 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  local_1f0 = 0;
  local_270[9] = (double)local_3d8._0_8_;
  uStack_220 = local_3d8._8_8_;
  uStack_210 = local_3d8._8_8_ ^ 0x8000000000000000;
  uStack_208 = local_3d8._0_8_;
  local_1e8 = 0x3ff0000000000000;
  local_1e0[3] = 0.0;
  local_1e0[5] = 0.0;
  local_1e0[6] = 0.0;
  local_1e0[1] = 0.0;
  local_1e0[2] = 0.0;
  local_1e0[7] = 0.0;
  local_1e0[0] = 1.0;
  local_1e0[4] = 1.0;
  local_1e0[8] = 1.0;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar11 = local_270;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      pdVar12 = pdVar11;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar16 != 3);
      local_1e0[lVar7 * 3 + lVar14] = dVar19;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  pvVar8 = &local_b0;
  local_98 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78 = 0;
  local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  uStack_90 = 0x3ff0000000000000;
  local_70 = 0x3ff0000000000000;
  pdVar9 = local_2f8;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar11 = pdVar9;
    do {
      (&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start)[lVar14] = (pointer)*pdVar11;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 3;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pvVar8 = pvVar8 + 1;
    pdVar9 = pdVar9 + 1;
  } while (lVar7 != 3);
  local_380[3] = 0.0;
  local_380[5] = 0.0;
  local_380[6] = 0.0;
  local_380[1] = 0.0;
  local_380[2] = 0.0;
  local_380[7] = 0.0;
  local_380[0] = 1.0;
  local_380[4] = 1.0;
  local_380[8] = 1.0;
  pdVar9 = local_1e0;
  lVar7 = 0;
  do {
    lVar14 = 0;
    ppdVar13 = (pointer *)&local_b0;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      ppdVar15 = ppdVar13;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * (double)*ppdVar15;
        lVar16 = lVar16 + 1;
        ppdVar15 = ppdVar15 + 3;
      } while (lVar16 != 3);
      local_380[lVar7 * 3 + lVar14] = dVar19;
      lVar14 = lVar14 + 1;
      ppdVar13 = ppdVar13 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)local_270 + lVar7 + 0x10) =
         *(undefined8 *)((long)local_380 + lVar7 + 0x10);
    uVar5 = *(undefined8 *)((long)local_380 + lVar7 + 8);
    *(undefined8 *)((long)local_270 + lVar7) = *(undefined8 *)((long)local_380 + lVar7);
    *(undefined8 *)((long)local_270 + lVar7 + 8) = uVar5;
    dVar23 = local_270[8];
    dVar2 = local_270[7];
    dVar19 = local_270[5];
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  local_3f8[3] = local_428[2];
  local_2a8 = local_3c8;
  uStack_2a0 = 0;
  local_438 = local_270[4];
  uStack_430 = 0;
  local_408 = local_270[5] * local_270[5];
  dVar25 = local_270[8] * local_270[8];
  local_448.len = 0xc;
  local_448.c = (double *)operator_new__(0x60);
  local_448.used = 1;
  *local_448.c = 0.0;
  local_298._8_4_ = (int)uStack_430;
  local_298._0_8_ = local_438 * dVar19;
  local_298._12_4_ = (int)(uStack_430 >> 0x20);
  uStack_c0 = uStack_430 ^ 0x8000000000000000;
  local_c8 = -(local_438 * dVar19) * dVar25;
  local_278 = local_408 * dVar2 * dVar23;
  Polynomial<double>::set(&local_448,0,local_278 + local_c8);
  local_398 = local_2a8 * local_2a8;
  local_3a8 = local_438 * local_438;
  local_3b8._8_8_ = 0;
  local_3b8._0_8_ = dVar2 * dVar2;
  local_280 = local_408 * dVar2 * dVar2;
  uStack_3a0 = uStack_430;
  local_380[9] = local_408 + local_408;
  uStack_390 = uStack_2a0;
  Polynomial<double>::set
            (&local_448,1,
             dVar25 * dVar25 * local_398 * local_398 +
             local_380[9] * dVar25 * local_398 +
             ((local_408 * local_408 + local_280) - local_3a8 * dVar25));
  local_308 = local_3f8[3] * local_3f8[3];
  local_f8 = -local_3a8;
  uStack_f0 = uStack_3a0 ^ 0x8000000000000000;
  local_298._0_8_ = (double)local_298._0_8_ * (double)local_3b8._0_8_;
  local_150[9] = dVar2 * local_f8 * dVar23;
  uStack_100 = 0;
  local_e8 = (local_438 + local_438) * dVar19;
  uStack_e0 = uStack_430;
  uStack_300 = 0;
  local_d8 = local_438 * 4.0 * dVar19;
  uStack_d0 = uStack_430;
  Polynomial<double>::set
            (&local_448,2,
             dVar2 * 4.0 * dVar25 * dVar23 * local_398 * local_398 +
             local_d8 * dVar25 * local_398 +
             local_408 * 4.0 * dVar2 * dVar23 * local_398 +
             ((dVar2 * local_380[9] * dVar23 * local_308 +
              local_438 * 4.0 * local_408 * dVar19 + (double)local_298._0_8_ + local_150[9]) -
             dVar25 * local_e8 * local_308));
  dVar21 = local_3a8 * 6.0 * local_408;
  local_408 = local_3a8 + local_3a8;
  uStack_400 = uStack_3a0;
  Polynomial<double>::set
            (&local_448,3,
             (double)local_3b8._0_8_ * 6.0 * dVar25 * local_398 * local_398 +
             local_408 * dVar25 * local_398 +
             local_438 * 8.0 * dVar19 * dVar2 * dVar23 * local_398 +
             local_380[9] * (double)local_3b8._0_8_ * local_398 +
             ((dVar21 + local_308 * local_380[9] * (double)local_3b8._0_8_) -
             local_408 * dVar25 * local_308));
  local_380[9] = local_308 * local_308;
  uStack_330 = uStack_300;
  Polynomial<double>::set
            (&local_448,4,
             (double)local_3b8._0_8_ * 4.0 * dVar2 * dVar23 * local_398 * local_398 +
             local_3a8 * 4.0 * dVar2 * dVar23 * local_398 +
             local_d8 * (double)local_3b8._0_8_ * local_398 +
             local_c8 * local_380[9] +
             local_278 * local_380[9] +
             ((local_438 * local_3a8 * 4.0 * dVar19 + local_e8 * (double)local_3b8._0_8_ * local_308
              ) - dVar2 * local_408 * dVar23 * local_308));
  Polynomial<double>::set
            (&local_448,5,
             (double)local_3b8._0_8_ * (double)local_3b8._0_8_ * local_398 * local_398 +
             local_408 * (double)local_3b8._0_8_ * local_398 +
             dVar25 * local_f8 * local_380[9] + local_3a8 * local_3a8 + local_280 * local_380[9]);
  Polynomial<double>::set
            (&local_448,6,(double)local_298._0_8_ * local_380[9] + local_150[9] * local_380[9]);
  realRoots(&local_b0,&local_448);
  pdVar6 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar17 = 0xffffffff;
    uVar18 = 0x7fefffff;
    dVar25 = 1.79769313486232e+308;
  }
  else {
    lVar7 = (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    dVar25 = 1.79769313486232e+308;
    lVar14 = 0;
    uVar17 = 0xffffffff;
    uVar18 = 0x7fefffff;
    do {
      dVar21 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14];
      dVar26 = local_438 * dVar21 + dVar19;
      dVar27 = dVar2 * dVar21 + dVar23;
      dVar26 = dVar26 * dVar26 + local_398 * dVar27 * dVar27;
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        auVar28._0_8_ = dVar21 * dVar21;
        auVar28._8_8_ = dVar27 * dVar27;
        auVar4._8_8_ = dVar26;
        auVar4._0_8_ = local_308 * dVar21 * dVar21 + 1.0;
        auVar22 = divpd(auVar28,auVar4);
        dVar26 = auVar22._8_8_ + auVar22._0_8_;
        if (dVar26 < dVar25) {
          uVar17 = SUB84(dVar21,0);
          uVar18 = (undefined4)((ulong)dVar21 >> 0x20);
          dVar25 = dVar26;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar14);
  }
  if ((0.0 < local_308) && (dVar21 = local_398 * dVar2 * dVar2 + local_3a8, 0.0 < dVar21)) {
    auVar24._8_8_ = local_3b8._0_8_;
    auVar24._0_8_ = 0x3ff0000000000000;
    auVar3._8_8_ = dVar21;
    auVar3._0_8_ = local_308;
    auVar22 = divpd(auVar24,auVar3);
    if (auVar22._8_8_ + auVar22._0_8_ < dVar25) {
      p0->v[0] = local_3f8[3];
      p0->v[1] = 0.0;
      p0->v[2] = local_308;
      p1->v[0] = (double)local_3b8._0_8_ * local_2a8;
      p1->v[1] = -local_438 * dVar2;
      dVar19 = local_398 * (double)local_3b8._0_8_ + local_3a8;
      goto LAB_00119719;
    }
  }
  dVar25 = (double)CONCAT44(uVar18,uVar17) * (double)CONCAT44(uVar18,uVar17);
  p0->v[0] = local_3f8[3] * dVar25;
  p0->v[1] = (double)CONCAT44(uVar18,uVar17);
  p0->v[2] = dVar25 * local_308 + 1.0;
  dVar23 = dVar2 * (double)CONCAT44(uVar18,uVar17) + dVar23;
  dVar19 = local_438 * (double)CONCAT44(uVar18,uVar17) + dVar19;
  auVar1._8_4_ = SUB84(dVar23 * -dVar19,0);
  auVar1._0_8_ = dVar23 * local_2a8 * dVar23;
  auVar1._12_4_ = (int)((ulong)(dVar23 * -dVar19) >> 0x20);
  *(undefined1 (*) [16])p1->v = auVar1;
  dVar19 = local_398 * dVar23 * dVar23 + dVar19 * dVar19;
LAB_00119719:
  p1->v[2] = dVar19;
  pdVar9 = local_1e0;
  local_1e0[3] = 0.0;
  local_1e0[5] = 0.0;
  local_1e0[6] = 0.0;
  local_1e0[1] = 0.0;
  local_1e0[2] = 0.0;
  local_1e0[7] = 0.0;
  local_1e0[0] = 1.0;
  local_1e0[4] = 1.0;
  local_1e0[8] = 1.0;
  pdVar11 = local_2f8;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar12 = pdVar11;
    do {
      pdVar9[lVar14] = *pdVar12;
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
    pdVar11 = pdVar11 + 1;
  } while (lVar7 != 3);
  local_380[3] = 0.0;
  local_380[5] = 0.0;
  local_380[6] = 0.0;
  local_380[1] = 0.0;
  local_380[2] = 0.0;
  local_380[7] = 0.0;
  local_380[0] = 1.0;
  local_380[4] = 1.0;
  local_380[8] = 1.0;
  pdVar9 = local_1e0 + 9;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar11 = local_1e0;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      pdVar12 = pdVar11;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar16 != 3);
      local_380[lVar7 * 3 + lVar14] = dVar19;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  local_3f8[0] = 0.0;
  local_3f8[1] = 0.0;
  local_3f8[2] = 0.0;
  pdVar9 = local_380;
  lVar7 = 0;
  do {
    dVar19 = local_3f8[lVar7];
    lVar14 = 0;
    do {
      dVar19 = dVar19 + pdVar9[lVar14] * p0->v[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_3f8[lVar7] = dVar19;
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  p0->v[2] = local_3f8[2];
  p0->v[0] = local_3f8[0];
  p0->v[1] = local_3f8[1];
  pdVar9 = local_1e0;
  local_1e0[3] = 0.0;
  local_1e0[5] = 0.0;
  local_1e0[6] = 0.0;
  local_1e0[1] = 0.0;
  local_1e0[2] = 0.0;
  local_1e0[7] = 0.0;
  local_1e0[0] = 1.0;
  local_1e0[4] = 1.0;
  local_1e0[8] = 1.0;
  pdVar11 = local_270 + 9;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar12 = pdVar11;
    do {
      pdVar9[lVar14] = *pdVar12;
      lVar14 = lVar14 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
    pdVar11 = pdVar11 + 1;
  } while (lVar7 != 3);
  local_380[3] = 0.0;
  local_380[5] = 0.0;
  local_380[6] = 0.0;
  local_380[1] = 0.0;
  local_380[2] = 0.0;
  local_380[7] = 0.0;
  local_380[0] = 1.0;
  local_380[4] = 1.0;
  local_380[8] = 1.0;
  pdVar9 = local_68;
  lVar7 = 0;
  do {
    lVar14 = 0;
    pdVar11 = local_1e0;
    do {
      dVar19 = 0.0;
      lVar16 = 0;
      pdVar12 = pdVar11;
      do {
        dVar19 = dVar19 + pdVar9[lVar16] * *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar16 != 3);
      local_380[lVar7 * 3 + lVar14] = dVar19;
      lVar14 = lVar14 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar14 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  local_3f8[0] = 0.0;
  local_3f8[1] = 0.0;
  local_3f8[2] = 0.0;
  pdVar9 = local_380;
  lVar7 = 0;
  do {
    dVar19 = local_3f8[lVar7];
    lVar14 = 0;
    do {
      dVar19 = dVar19 + pdVar9[lVar14] * p1->v[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    local_3f8[lVar7] = dVar19;
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  p1->v[2] = local_3f8[2];
  p1->v[0] = local_3f8[0];
  p1->v[1] = local_3f8[1];
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6);
  }
  if (local_448.c != (double *)0x0) {
    operator_delete__(local_448.c);
  }
  return;
}

Assistant:

void refineOptimal(const Matrix34d &RT1, Vector3d &p0, Vector3d &p1)
{
  const Matrix33d R=getRotation(RT1);
  const Vector3d T=RT1.getColumn(3);
  Matrix33d F=createEssential(R, T);

  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  F=transpose(invT1)*F*invT0;

  // get epipoles that correspond to new fundamental matrix

  Vector3d e1=T;
  Vector3d e0=transpose(R)*-T;

  e0/=e0[2];
  e1/=e1[2];
  e0[0]-=p0[0]/p0[2];
  e0[1]-=p0[1]/p0[2];
  e1[0]-=p1[0]/p1[2];
  e1[1]-=p1[1]/p1[2];

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);

  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;

  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F=R1*F*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F(1, 1);
  const double b=F(1, 2);
  const double c=F(2, 1);
  const double d=F(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}